

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPSCQueue.h
# Opt level: O1

void __thiscall
rigtorp::SPSCQueue<int,_Allocator<int>_>::~SPSCQueue(SPSCQueue<int,_Allocator<int>_> *this)

{
  __int_type _Var1;
  __int_type _Var2;
  int *piVar3;
  
  do {
    _Var1 = (this->readIdx_).super___atomic_base<unsigned_long>._M_i;
    if (_Var1 == this->writeIdxCache_) {
      _Var2 = (this->writeIdx_).super___atomic_base<unsigned_long>._M_i;
      this->writeIdxCache_ = _Var2;
      if (_Var2 == _Var1) {
LAB_0010151d:
        munmap(this->slots_,(this->capacity_ * 4 + 0x7f & 0xffffffffffe00000) + 0x200000);
        return;
      }
      piVar3 = this->slots_;
    }
    else {
      piVar3 = this->slots_;
    }
    if (piVar3 + _Var1 == (int *)0xffffffffffffffc0) goto LAB_0010151d;
    pop(this);
  } while( true );
}

Assistant:

~SPSCQueue() {
    while (front()) {
      pop();
    }
    std::allocator_traits<Allocator>::deallocate(allocator_, slots_,
                                                 capacity_ + 2 * kPadding);
  }